

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<1ul,int>(Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
                *this,char (*params) [7])

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint32_t *in_RDX;
  uint uVar4;
  long lVar6;
  long lVar7;
  ulong uVar5;
  
  lVar7 = 0;
  if (*(long *)(params[0xd] + 5) != 0) {
    lVar2 = *(long *)params;
    uVar3 = _::intHash32(*in_RDX);
    uVar4 = (int)*(long *)(params[0xd] + 5) - 1U & uVar3;
    while( true ) {
      uVar5 = (ulong)uVar4;
      iVar1 = *(int *)(*(long *)(params[0xc] + 4) + 4 + uVar5 * 8);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(*(long *)(params[0xc] + 4) + uVar5 * 8) == uVar3)) &&
         (lVar6 = (ulong)(iVar1 - 2) * 0x18, *(uint32_t *)(lVar2 + 0x10 + lVar6) == *in_RDX)) {
        lVar7 = lVar6 + *(long *)params;
        break;
      }
      uVar4 = (uint)(uVar5 + 1);
      if (uVar5 + 1 == *(long *)(params[0xd] + 5)) {
        uVar4 = 0;
      }
    }
  }
  *(long *)this = lVar7;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}